

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_collector.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalArrowCollector::GetGlobalSinkState
          (PhysicalArrowCollector *this,ClientContext *context)

{
  _func_int **in_RAX;
  
  make_uniq<duckdb::ArrowCollectorGlobalState>();
  (this->super_PhysicalResultCollector).super_PhysicalOperator._vptr_PhysicalOperator = in_RAX;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalArrowCollector::GetGlobalSinkState(ClientContext &context) const {
	return make_uniq<ArrowCollectorGlobalState>();
}